

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O1

optional<long> ToIntegral<long>(string_view str)

{
  char *__last;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<long> _Var1;
  optional<long> oVar2;
  long result;
  _Storage<long,_true> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  __last = str._M_str + str._M_len;
  _Var1 = std::from_chars<long>(str._M_str,__last,&local_20._M_value,10);
  oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_ =
       _Var1._9_7_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = _Var1.ptr == __last && _Var1.ec == 0;
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = local_20._M_value;
    return (optional<long>)
           oVar2.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<T> ToIntegral(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    const auto [first_nonmatching, error_condition] = std::from_chars(str.data(), str.data() + str.size(), result);
    if (first_nonmatching != str.data() + str.size() || error_condition != std::errc{}) {
        return std::nullopt;
    }
    return result;
}